

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int FN_Down_Field(FORM *form)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short sVar4;
  unsigned_short uVar5;
  int iVar6;
  WINDOW_conflict *pWVar7;
  FIELD *pFVar8;
  FIELD *field_on_page;
  FIELD *field;
  bool bVar9;
  
  field = form->current;
  psVar1 = &field->frow;
  psVar2 = &field->fcol;
  pFVar8 = field;
LAB_003a4ad5:
  do {
    field = field->snext;
    if (field != pFVar8) {
      if ((field->opts & 3U) != 3) goto LAB_003a4ad5;
    }
    psVar3 = &field->frow;
    sVar4 = field->fcol;
    if (*psVar3 != *psVar1) {
      bVar9 = true;
      goto joined_r0x003a4b0b;
    }
    pFVar8 = field;
  } while (sVar4 != *psVar2);
LAB_003a4b5e:
  iVar6 = _nc_Set_Current_Field(form,field);
  return iVar6;
joined_r0x003a4b0b:
  pFVar8 = field;
  if (*psVar2 <= sVar4) goto LAB_003a4b36;
  do {
    pFVar8 = pFVar8->snext;
    if (pFVar8 == field) break;
  } while ((pFVar8->opts & 3U) != 3);
  bVar9 = pFVar8->frow == *psVar3;
  field = pFVar8;
  if (!bVar9) goto LAB_003a4b46;
  sVar4 = pFVar8->fcol;
  goto joined_r0x003a4b0b;
LAB_003a4b36:
  if (!bVar9) {
LAB_003a4b46:
    do {
      field = field->sprev;
      if (field == pFVar8) goto code_r0x003a3495;
    } while ((field->opts & 3U) != 3);
    goto LAB_003a4b5e;
  }
code_r0x003a3495:
  if (field == (FIELD *)0x0 || form == (FORM *)0x0) {
    return -2;
  }
  pFVar8 = form->current;
  if (pFVar8 == (FIELD *)0x0) {
    return -2;
  }
  if (field->form != form) {
    return -2;
  }
  if ((form->status & 2) != 0) {
    return -5;
  }
  if (form->field == (FIELD **)0x0) {
    return -0xb;
  }
  if ((pFVar8 == field & (byte)form->status) != 0) goto LAB_003a366a;
  if (((form->w != (WINDOW_conflict *)0x0) && ((pFVar8->opts & 1) != 0)) &&
     (pFVar8->form->curpage == pFVar8->page)) {
    _nc_Refresh_Current_Field(form);
    if ((pFVar8->opts & 4U) != 0) {
      if ((int)pFVar8->rows < pFVar8->drows) {
        if (form->toprow == 0) {
          uVar5 = pFVar8->status & 0xfffd;
        }
        else {
          uVar5 = pFVar8->status | 2;
        }
        pFVar8->status = uVar5;
      }
      else if (((pFVar8->just != 0) && ((int)pFVar8->rows + pFVar8->nrow == 1)) &&
              ((((uint)pFVar8->opts >> 9 & 1) != 0 && (pFVar8->dcols == (int)pFVar8->cols)))) {
        Window_To_Buffer(form->w,pFVar8);
        werase(form->w);
        Perform_Justification(pFVar8,form->w);
        wsyncup(form->w);
      }
    }
    delwin(form->w);
  }
  if ((((field->opts & 4) == 0) || ((int)field->rows < field->drows)) ||
     ((int)field->cols < field->dcols)) {
    pWVar7 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
  }
  else {
    pWVar7 = form->sub;
    if ((form->sub == (WINDOW_conflict *)0x0) &&
       (pWVar7 = form->win, form->win == (WINDOW_conflict *)0x0)) {
      pWVar7 = _stdscr;
    }
    pWVar7 = (WINDOW_conflict *)
             derwin(pWVar7,(int)field->rows,(int)field->cols,(int)field->frow,(int)field->fcol);
  }
  if (pWVar7 == (WINDOW_conflict *)0x0) {
    return -1;
  }
  form->current = field;
  form->w = pWVar7;
  *(byte *)&form->status = (byte)form->status & 0xef;
  wbkgdset(pWVar7,field->back | field->pad);
  wattrset(form->w,field->fore);
  if (((field->opts & 4U) == 0) || ((int)field->rows < field->drows)) {
LAB_003a362f:
    werase(form->w);
    Buffer_To_Window(field,form->w);
  }
  else {
    if ((int)field->cols < field->dcols) goto LAB_003a362f;
    if ((((field->just != 0) && (((uint)field->opts >> 9 & 1) != 0)) &&
        (field->dcols == (int)field->cols)) && ((int)field->rows + field->nrow == 1)) {
      werase(form->w);
      Undo_Justification(field,form->w);
      wsyncup(form->w);
    }
  }
  pWVar7 = form->w;
  if (pWVar7 == (WINDOW_conflict *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = pWVar7->_maxy + 1;
  }
  wtouchln(pWVar7,0,iVar6,0);
LAB_003a366a:
  form->currow = 0;
  form->curcol = 0;
  form->toprow = 0;
  form->begincol = 0;
  return 0;
}

Assistant:

static int FN_Down_Field(FORM * form)
{
  return _nc_Set_Current_Field(form,
                               Down_Neighbour_Field(form->current));
}